

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uic.cpp
# Opt level: O3

bool __thiscall Uic::isContainer(Uic *this,QString *className)

{
  bool bVar1;
  
  if (isContainer(QString_const&)::containers == '\0') {
    isContainer();
  }
  bVar1 = CustomWidgetsInfo::extendsOneOf(&this->cWidgetsInfo,className,&isContainer::containers);
  return bVar1;
}

Assistant:

bool Uic::isContainer(const QString &className) const
{
    static const QStringList containers = {
        u"QStackedWidget"_s, u"QToolBox"_s,
        u"QTabWidget"_s, u"QScrollArea"_s,
        u"QMdiArea"_s, u"QWizard"_s,
        u"QDockWidget"_s
    };

    return customWidgetsInfo()->extendsOneOf(className, containers);
}